

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O3

void cm_zlib_gzclearerr(gzFile file)

{
  if (file != (gzFile)0x0) {
    if (file[1].have != 0x79b1) {
      if (file[1].have != 0x1c4f) {
        return;
      }
      file[3].next = (uchar *)0x0;
    }
    if (*(void **)(file + 5) != (void *)0x0) {
      if (*(int *)((long)&file[4].pos + 4) != -4) {
        free(*(void **)(file + 5));
      }
      *(undefined8 *)(file + 5) = 0;
    }
    *(undefined4 *)((long)&file[4].pos + 4) = 0;
  }
  return;
}

Assistant:

void ZEXPORT gzclearerr(file)
    gzFile file;
{
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return;

    /* clear error and end-of-file */
    if (state->mode == GZ_READ) {
        state->eof = 0;
        state->past = 0;
    }
    gz_error(state, Z_OK, NULL);
}